

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iomapper.cpp
# Opt level: O0

int __thiscall
glslang::TSymbolValidater::checkLocationOverlap
          (TSymbolValidater *this,TRange *locationRange,
          vector<glslang::TRange,_std::allocator<glslang::TRange>_> *usedUniformLocation,
          TString *symbolName,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
          *usedUniformName,bool *diffLocation)

{
  bool bVar1;
  size_type sVar2;
  reference __lhs;
  reference pvVar3;
  int *piVar4;
  int local_5c;
  ulong local_48;
  size_t r;
  bool *diffLocation_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
  *usedUniformName_local;
  TString *symbolName_local;
  vector<glslang::TRange,_std::allocator<glslang::TRange>_> *usedUniformLocation_local;
  TRange *locationRange_local;
  TSymbolValidater *this_local;
  
  local_48 = 0;
  while( true ) {
    sVar2 = std::vector<glslang::TRange,_std::allocator<glslang::TRange>_>::size
                      (usedUniformLocation);
    if (sVar2 <= local_48) {
      return -1;
    }
    __lhs = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
            ::operator[](usedUniformName,local_48);
    bVar1 = std::operator==(__lhs,symbolName);
    if (bVar1) break;
    pvVar3 = std::vector<glslang::TRange,_std::allocator<glslang::TRange>_>::operator[]
                       (usedUniformLocation,local_48);
    bVar1 = TRange::overlap(locationRange,pvVar3);
    if (bVar1) {
      pvVar3 = std::vector<glslang::TRange,_std::allocator<glslang::TRange>_>::operator[]
                         (usedUniformLocation,local_48);
      piVar4 = std::max<int>(&locationRange->start,&pvVar3->start);
      return *piVar4;
    }
    local_48 = local_48 + 1;
  }
  *diffLocation = true;
  pvVar3 = std::vector<glslang::TRange,_std::allocator<glslang::TRange>_>::operator[]
                     (usedUniformLocation,local_48);
  if ((pvVar3->start == locationRange->start) &&
     (pvVar3 = std::vector<glslang::TRange,_std::allocator<glslang::TRange>_>::operator[]
                         (usedUniformLocation,local_48), pvVar3->last == locationRange->last)) {
    local_5c = -2;
  }
  else {
    pvVar3 = std::vector<glslang::TRange,_std::allocator<glslang::TRange>_>::operator[]
                       (usedUniformLocation,local_48);
    piVar4 = std::max<int>(&locationRange->start,&pvVar3->start);
    local_5c = *piVar4;
  }
  return local_5c;
}

Assistant:

int checkLocationOverlap(const TRange& locationRange, std::vector<TRange>& usedUniformLocation, const TString symbolName, std::vector<TString>& usedUniformName, bool& diffLocation)
    {
        for (size_t r = 0; r < usedUniformLocation.size(); ++r) {
            if (usedUniformName[r] == symbolName) {
                diffLocation = true;
                return (usedUniformLocation[r].start == locationRange.start &&
                        usedUniformLocation[r].last == locationRange.last)
                       ? -2 : std::max(locationRange.start, usedUniformLocation[r].start);
            }
            if (locationRange.overlap(usedUniformLocation[r])) {
                // there is a collision; pick one
                return std::max(locationRange.start, usedUniformLocation[r].start);
            }
        }

        return -1; // no collision
    }